

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticline.cpp
# Opt level: O3

void pzgeom::TPZQuadraticLine::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  bool bVar6;
  int iVar7;
  TPZGeoNode *pTVar8;
  TPZGeoEl **ppTVar9;
  TPZGeoEl *pTVar10;
  bool bVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int64_t index;
  TPZManVector<double,_3> co;
  TPZManVector<long,_3> nodeindexes;
  TPZManVector<double,_3> shift;
  TPZManVector<double,_3> scale;
  int64_t local_128;
  TPZVec<double> *local_120;
  TPZVec<double> *local_118;
  TPZManVector<double,_3> local_110;
  TPZVec<long> local_d8;
  long local_b8 [3];
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  TPZManVector<double,_3>::TPZManVector(&local_110,3);
  TPZManVector<double,_3>::TPZManVector(&local_a0,3);
  TPZManVector<double,_3>::TPZManVector(&local_68,3);
  TPZVec<long>::TPZVec(&local_d8,0);
  local_d8.fStore = local_b8;
  local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0187b688;
  local_d8.fNElements = 2;
  local_d8.fNAlloc = 0;
  pdVar4 = size->fStore;
  pdVar5 = lowercorner->fStore;
  lVar12 = 0;
  do {
    local_68.super_TPZVec<double>.fStore[lVar12] = pdVar4[lVar12] / 3.0;
    local_a0.super_TPZVec<double>.fStore[lVar12] = pdVar5[lVar12] + 0.5;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  lVar12 = 0;
  bVar6 = true;
  local_120 = lowercorner;
  local_118 = size;
  do {
    bVar11 = bVar6;
    pztopology::TPZLine::ParametricDomainNodeCoord((int)lVar12,&local_110.super_TPZVec<double>);
    if (local_110.super_TPZVec<double>.fNElements < 1) {
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      do {
        dVar1 = local_68.super_TPZVec<double>.fStore[uVar14];
        dVar2 = local_110.super_TPZVec<double>.fStore[uVar14];
        dVar3 = local_a0.super_TPZVec<double>.fStore[uVar14];
        iVar7 = rand();
        local_110.super_TPZVec<double>.fStore[uVar14] =
             ((double)iVar7 * 0.2) / 2147483647.0 + dVar1 * dVar2 + dVar3 + -0.1;
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < local_110.super_TPZVec<double>.fNElements);
    }
    TPZManVector<double,_3>::Resize(&local_110,3);
    if ((uint)uVar14 < 3) {
      uVar14 = uVar14 & 0xffffffff;
      do {
        uVar15 = uVar14 + 1;
        dVar1 = local_a0.super_TPZVec<double>.fStore[uVar14];
        iVar7 = rand();
        local_110.super_TPZVec<double>.fStore[uVar14] =
             ((double)iVar7 * 0.2) / 2147483647.0 + dVar1 + -0.1;
        uVar14 = uVar15;
      } while ((int)uVar15 != 3);
    }
    iVar7 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    local_d8.fStore[lVar12] = (long)iVar7;
    pTVar8 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar7);
    TPZGeoNode::Initialize(pTVar8,&local_110.super_TPZVec<double>,gmesh);
    lVar12 = 1;
    bVar6 = false;
  } while (bVar11);
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])
            (gmesh,1,&local_d8,(ulong)(uint)matid,&local_128,1);
  ppTVar9 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(gmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,local_128);
  pTVar10 = *ppTVar9;
  iVar7 = (**(code **)(*(long *)pTVar10 + 0xf0))(pTVar10);
  if (0 < iVar7) {
    iVar13 = 0;
    do {
      (**(code **)(*(long *)pTVar10 + 0x180))(pTVar10,iVar13);
      iVar13 = iVar13 + 1;
    } while (iVar7 != iVar13);
  }
  pTVar10 = TPZChangeEl::ChangeToQuadratic(gmesh,local_128);
  TPZGeoEl::NodePtr(pTVar10,2);
  pdVar4 = local_120->fStore;
  pdVar5 = local_118->fStore;
  lVar12 = 0;
  do {
    local_110.super_TPZVec<double>.fStore[lVar12] = pdVar5[lVar12] * 0.5 + pdVar4[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  pTVar8 = TPZGeoEl::NodePtr(pTVar10,2);
  TPZGeoNode::SetCoord(pTVar8,&local_110.super_TPZVec<double>);
  if (local_d8.fStore != local_b8) {
    local_d8.fNAlloc = 0;
    local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_d8.fStore != (long *)0x0) {
      operator_delete__(local_d8.fStore);
    }
  }
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  TPZManVector<double,_3>::~TPZManVector(&local_a0);
  TPZManVector<double,_3>::~TPZManVector(&local_110);
  return;
}

Assistant:

void TPZQuadraticLine::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    TPZManVector<REAL,3> co(3),shift(3),scale(3);
    TPZManVector<int64_t,3> nodeindexes(2);
    for (int i=0; i<3; i++) {
        scale[i] = size[i]/3.;
        shift[i] = 1./2.+lowercorner[i];
    }
    
    for (int i=0; i<NCornerNodes; i++) {
        ParametricDomainNodeCoord(i, co);
        int j;
        for (j=0; j<co.size(); j++) {
            co[j] = shift[j]+scale[j]*co[j]+(rand()*0.2/RAND_MAX)-0.1;
        }
        co.Resize(3);
        for (; j<3; j++) {
            co[j] = shift[j]+(rand()*0.2/RAND_MAX)-0.1;
        }
        nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
    }
    int64_t index;
    gmesh.CreateGeoElement(EOned, nodeindexes, matid, index);
    TPZGeoEl *gel = gmesh.Element(index);
    int nsides = gel->NSides();
    for (int is = 0; is<nsides; is++) {
        gel->SetSideDefined(is);
    }
    
    gel = TPZChangeEl::ChangeToQuadratic(&gmesh,index);
    TPZGeoNode *nodeptr = gel->NodePtr(2);
    for (int i=0; i<3; i++) {
        co[i] = lowercorner[i]+size[i]/2.;
    }
    gel->NodePtr(2)->SetCoord(co);
}